

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_font_atlas_end(nk_font_atlas *atlas,nk_handle texture,nk_draw_null_texture *null)

{
  undefined8 *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  nk_vec2 nVar1;
  nk_font *font_iter;
  int i;
  undefined8 *local_28;
  int local_1c;
  
  if (in_RDI == (undefined8 *)0x0) {
    if (in_RDX == (undefined8 *)0x0) {
      return;
    }
    *in_RDX = in_RSI;
    nVar1 = nk_vec2(0.5,0.5);
    *(nk_vec2 *)(in_RDX + 1) = nVar1;
  }
  if (in_RDX != (undefined8 *)0x0) {
    *in_RDX = in_RSI;
    *(float *)(in_RDX + 1) =
         ((float)(int)*(short *)(in_RDI + 8) + 0.5) / (float)*(int *)(in_RDI + 1);
    *(float *)((long)in_RDX + 0xc) =
         ((float)(int)*(short *)((long)in_RDI + 0x42) + 0.5) / (float)*(int *)((long)in_RDI + 0xc);
  }
  for (local_28 = (undefined8 *)in_RDI[0x2f]; local_28 != (undefined8 *)0x0;
      local_28 = (undefined8 *)*local_28) {
    local_28[0xe] = in_RSI;
    local_28[5] = in_RSI;
  }
  for (local_1c = 0; local_1c < 7; local_1c = local_1c + 1) {
    in_RDI[(long)local_1c * 5 + 9] = in_RSI;
  }
  (*(code *)in_RDI[7])(in_RDI[5],*in_RDI);
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 1) = 0;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  *(undefined2 *)(in_RDI + 8) = 0;
  *(undefined2 *)((long)in_RDI + 0x42) = 0;
  *(undefined2 *)((long)in_RDI + 0x44) = 0;
  *(undefined2 *)((long)in_RDI + 0x46) = 0;
  return;
}

Assistant:

NK_API void
nk_font_atlas_end(struct nk_font_atlas *atlas, nk_handle texture,
struct nk_draw_null_texture *null)
{
int i = 0;
struct nk_font *font_iter;
NK_ASSERT(atlas);
if (!atlas) {
if (!null) return;
null->texture = texture;
null->uv = nk_vec2(0.5f,0.5f);
}
if (null) {
null->texture = texture;
null->uv.x = (atlas->custom.x + 0.5f)/(float)atlas->tex_width;
null->uv.y = (atlas->custom.y + 0.5f)/(float)atlas->tex_height;
}
for (font_iter = atlas->fonts; font_iter; font_iter = font_iter->next) {
font_iter->texture = texture;
#ifdef NK_INCLUDE_VERTEX_BUFFER_OUTPUT
font_iter->handle.texture = texture;
#endif
}
for (i = 0; i < NK_CURSOR_COUNT; ++i)
atlas->cursors[i].img.handle = texture;

atlas->temporary.free(atlas->temporary.userdata, atlas->pixel);
atlas->pixel = 0;
atlas->tex_width = 0;
atlas->tex_height = 0;
atlas->custom.x = 0;
atlas->custom.y = 0;
atlas->custom.w = 0;
atlas->custom.h = 0;
}